

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.cc
# Opt level: O0

bool __thiscall
testing::internal::UnorderedElementsAreMatcherImplBase::VerifyMatchMatrix
          (UnorderedElementsAreMatcherImplBase *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *element_printouts,MatchMatrix *matrix,MatchResultListener *listener)

{
  value_type pMVar1;
  unsigned_long uVar2;
  char *pcVar3;
  byte bVar4;
  ulong uVar5;
  undefined1 uVar6;
  bool bVar7;
  Flags FVar8;
  size_t sVar9;
  size_t sVar10;
  byte *pbVar11;
  char *pcVar12;
  reference pvVar13;
  MatchResultListener *pMVar14;
  const_reference ppMVar15;
  ostream *poVar16;
  size_type sVar17;
  const_reference x;
  unsigned_long local_c0;
  size_t ei;
  char *outer_sep;
  char *sep_1;
  size_t mi;
  char *sep;
  ulong uStack_90;
  char matched;
  size_t irhs;
  size_t ilhs;
  undefined1 local_78 [8];
  vector<char,_std::allocator<char>_> matcher_matched;
  allocator_type local_4a;
  value_type_conflict1 local_49;
  undefined1 local_48 [8];
  vector<char,_std::allocator<char>_> element_matched;
  bool result;
  MatchResultListener *listener_local;
  MatchMatrix *matrix_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *element_printouts_local;
  UnorderedElementsAreMatcherImplBase *this_local;
  
  element_matched.super__Vector_base<char,_std::allocator<char>_>._M_impl._23_1_ = 1;
  sVar9 = MatchMatrix::LhsSize(matrix);
  local_49 = '\0';
  std::allocator<char>::allocator();
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)local_48,sVar9,&local_49,&local_4a);
  std::allocator<char>::~allocator(&local_4a);
  sVar9 = MatchMatrix::RhsSize(matrix);
  ilhs._7_1_ = 0;
  std::allocator<char>::allocator();
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)local_78,sVar9,
             (value_type_conflict1 *)((long)&ilhs + 7),(allocator_type *)((long)&ilhs + 6));
  std::allocator<char>::~allocator((allocator<char> *)((long)&ilhs + 6));
  for (irhs = 0; sVar9 = irhs, sVar10 = MatchMatrix::LhsSize(matrix), sVar9 < sVar10;
      irhs = irhs + 1) {
    for (uStack_90 = 0; uVar5 = uStack_90, sVar9 = MatchMatrix::RhsSize(matrix), uVar5 < sVar9;
        uStack_90 = uStack_90 + 1) {
      bVar7 = MatchMatrix::HasEdge(matrix,irhs,uStack_90);
      sep._7_1_ = bVar7;
      pbVar11 = (byte *)std::vector<char,_std::allocator<char>_>::operator[]
                                  ((vector<char,_std::allocator<char>_> *)local_48,irhs);
      bVar4 = sep._7_1_;
      *pbVar11 = *pbVar11 | bVar7;
      pbVar11 = (byte *)std::vector<char,_std::allocator<char>_>::operator[]
                                  ((vector<char,_std::allocator<char>_> *)local_78,uStack_90);
      *pbVar11 = *pbVar11 | bVar4;
    }
  }
  FVar8 = match_flags(this);
  if ((FVar8 & Superset) != 0) {
    mi = (size_t)anon_var_dwarf_10c6f3;
    for (sep_1 = (char *)0x0; pcVar3 = sep_1,
        pcVar12 = (char *)std::vector<char,_std::allocator<char>_>::size
                                    ((vector<char,_std::allocator<char>_> *)local_78),
        pcVar3 < pcVar12; sep_1 = sep_1 + 1) {
      pvVar13 = std::vector<char,_std::allocator<char>_>::operator[]
                          ((vector<char,_std::allocator<char>_> *)local_78,(size_type)sep_1);
      if (*pvVar13 == '\0') {
        element_matched.super__Vector_base<char,_std::allocator<char>_>._M_impl._23_1_ = 0;
        bVar7 = MatchResultListener::IsInterested(listener);
        if (bVar7) {
          pMVar14 = MatchResultListener::operator<<(listener,(char **)&mi);
          pMVar14 = MatchResultListener::operator<<(pMVar14,(char (*) [10])0x1eb174);
          pMVar14 = MatchResultListener::operator<<(pMVar14,(unsigned_long *)&sep_1);
          MatchResultListener::operator<<(pMVar14,(char (*) [3])0x1e8caa);
          ppMVar15 = std::
                     vector<const_testing::MatcherDescriberInterface_*,_std::allocator<const_testing::MatcherDescriberInterface_*>_>
                     ::operator[]((vector<const_testing::MatcherDescriberInterface_*,_std::allocator<const_testing::MatcherDescriberInterface_*>_>
                                   *)(this + 8),(size_type)sep_1);
          pMVar1 = *ppMVar15;
          poVar16 = MatchResultListener::stream(listener);
          (*pMVar1->_vptr_MatcherDescriberInterface[2])(pMVar1,poVar16);
          mi = (long)"\",\n" + 1;
        }
      }
    }
  }
  FVar8 = match_flags(this);
  if ((FVar8 & Subset) != 0) {
    outer_sep = "where the following elements don\'t match any matchers:\n";
    ei = (long)"  \t" + 3;
    if ((element_matched.super__Vector_base<char,_std::allocator<char>_>._M_impl._23_1_ & 1) == 0) {
      ei = (long)",\nand " + 1;
    }
    for (local_c0 = 0; uVar2 = local_c0,
        sVar17 = std::vector<char,_std::allocator<char>_>::size
                           ((vector<char,_std::allocator<char>_> *)local_48), uVar2 < sVar17;
        local_c0 = local_c0 + 1) {
      pvVar13 = std::vector<char,_std::allocator<char>_>::operator[]
                          ((vector<char,_std::allocator<char>_> *)local_48,local_c0);
      if (*pvVar13 == '\0') {
        element_matched.super__Vector_base<char,_std::allocator<char>_>._M_impl._23_1_ = 0;
        bVar7 = MatchResultListener::IsInterested(listener);
        if (bVar7) {
          pMVar14 = MatchResultListener::operator<<(listener,(char **)&ei);
          pMVar14 = MatchResultListener::operator<<(pMVar14,&outer_sep);
          pMVar14 = MatchResultListener::operator<<(pMVar14,(char (*) [10])0x1eaf5c);
          pMVar14 = MatchResultListener::operator<<(pMVar14,&local_c0);
          pMVar14 = MatchResultListener::operator<<(pMVar14,(char (*) [3])0x1e8caa);
          x = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[](element_printouts,local_c0);
          MatchResultListener::operator<<(pMVar14,x);
          outer_sep = ",\n";
          ei = (long)"  \t" + 3;
        }
      }
    }
  }
  uVar6 = element_matched.super__Vector_base<char,_std::allocator<char>_>._M_impl._23_1_;
  std::vector<char,_std::allocator<char>_>::~vector((vector<char,_std::allocator<char>_> *)local_78)
  ;
  std::vector<char,_std::allocator<char>_>::~vector((vector<char,_std::allocator<char>_> *)local_48)
  ;
  return (bool)(uVar6 & 1);
}

Assistant:

bool UnorderedElementsAreMatcherImplBase::VerifyMatchMatrix(
    const ::std::vector<std::string>& element_printouts,
    const MatchMatrix& matrix, MatchResultListener* listener) const {
  bool result = true;
  ::std::vector<char> element_matched(matrix.LhsSize(), 0);
  ::std::vector<char> matcher_matched(matrix.RhsSize(), 0);

  for (size_t ilhs = 0; ilhs < matrix.LhsSize(); ilhs++) {
    for (size_t irhs = 0; irhs < matrix.RhsSize(); irhs++) {
      char matched = matrix.HasEdge(ilhs, irhs);
      element_matched[ilhs] |= matched;
      matcher_matched[irhs] |= matched;
    }
  }

  if (match_flags() & UnorderedMatcherRequire::Superset) {
    const char* sep =
        "where the following matchers don't match any elements:\n";
    for (size_t mi = 0; mi < matcher_matched.size(); ++mi) {
      if (matcher_matched[mi]) continue;
      result = false;
      if (listener->IsInterested()) {
        *listener << sep << "matcher #" << mi << ": ";
        matcher_describers_[mi]->DescribeTo(listener->stream());
        sep = ",\n";
      }
    }
  }

  if (match_flags() & UnorderedMatcherRequire::Subset) {
    const char* sep =
        "where the following elements don't match any matchers:\n";
    const char* outer_sep = "";
    if (!result) {
      outer_sep = "\nand ";
    }
    for (size_t ei = 0; ei < element_matched.size(); ++ei) {
      if (element_matched[ei]) continue;
      result = false;
      if (listener->IsInterested()) {
        *listener << outer_sep << sep << "element #" << ei << ": "
                  << element_printouts[ei];
        sep = ",\n";
        outer_sep = "";
      }
    }
  }
  return result;
}